

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair_hash.hpp
# Opt level: O2

int __thiscall
pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int>::init
          (pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int> *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  uint in_ECX;
  undefined8 in_RDX;
  allocator_type local_5a;
  allocator_type local_59;
  _Vector_base<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_> local_58;
  vector<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  local_40;
  value_type local_28;
  
  (this->null).F_ab = in_ECX;
  (this->null).P_ab = (int)in_RDX;
  (this->null).L_ab = (int)((ulong)in_RDX >> 0x20);
  std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>::vector
            ((vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_> *)&local_58,
             (ulong)ctx & 0xffffffff,&local_28,&local_59);
  std::
  vector<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  ::vector(&local_40,(ulong)ctx & 0xffffffff,(value_type *)&local_58,&local_5a);
  std::
  vector<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  ::_M_move_assign(&this->H,&local_40);
  std::
  vector<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  ::~vector(&local_40);
  std::_Vector_base<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>::~_Vector_base
            (&local_58);
  return extraout_EAX;
}

Assistant:

void init(itype max_alphabet_size, el_type null_el){

		this->null = null_el;

		H = vector<vector<el_type> >(max_alphabet_size,vector<el_type>(max_alphabet_size,null_el));

	}